

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen.h
# Opt level: O3

void __thiscall
flatbuffers::BaseBfbsGenerator::ForAllFields
          (BaseBfbsGenerator *this,Object *object,bool reverse,
          function<void_(const_reflection::Field_*)> *func)

{
  ulong uVar1;
  undefined8 uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  Object *pOVar6;
  long lVar7;
  ulong uVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> field_to_id_map;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  Object *local_38;
  
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&local_58,
             (ulong)*(uint *)(object + (ulong)*(uint *)(object + *(ushort *)
                                                                  (object + (6 - (long)*(int *)
                                                  object))) +
                                       (ulong)*(ushort *)(object + (6 - (long)*(int *)object))));
  uVar1 = (ulong)*(ushort *)(object + (6 - (long)*(int *)object));
  uVar8 = (ulong)*(uint *)(object + uVar1);
  uVar4 = (ulong)*(uint *)(object + uVar8 + uVar1);
  if (*(uint *)(object + uVar8 + uVar1) != 0) {
    uVar3 = 0;
    uVar5 = 0;
    do {
      if (uVar4 <= uVar5) goto LAB_00326d96;
      lVar7 = (ulong)*(uint *)(object + (ulong)uVar3 + 4 + uVar8 + uVar1) +
              (ulong)uVar3 + uVar8 + uVar1;
      pOVar6 = object + lVar7 + 4;
      if ((*(ushort *)(pOVar6 + -(long)*(int *)pOVar6) < 9) ||
         ((ulong)*(ushort *)(object + ((lVar7 + 0xc) - (long)*(int *)pOVar6)) == 0)) {
        uVar1 = 0;
      }
      else {
        uVar1 = (ulong)*(ushort *)
                        (pOVar6 + *(ushort *)(object + ((lVar7 + 0xc) - (long)*(int *)pOVar6)));
      }
      local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar1] = (uint)uVar5;
      uVar5 = uVar5 + 1;
      uVar1 = (ulong)*(ushort *)(object + (6 - (long)*(int *)object));
      uVar8 = (ulong)*(uint *)(object + uVar1);
      uVar4 = (ulong)*(uint *)(object + uVar8 + uVar1);
      uVar3 = uVar3 + 4;
    } while (uVar5 < uVar4);
  }
  if ((long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    uVar1 = (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    lVar7 = -1;
    uVar8 = 0;
    do {
      if ((*(ushort *)(object + -(long)*(int *)object) < 7) ||
         (uVar4 = (ulong)*(ushort *)(object + (6 - (long)*(int *)object)), uVar4 == 0)) {
        pOVar6 = (Object *)0x0;
      }
      else {
        pOVar6 = object + *(uint *)(object + uVar4) + uVar4;
      }
      uVar1 = uVar1 + lVar7;
      if (!reverse) {
        uVar1 = uVar8;
      }
      if (*(uint *)pOVar6 <=
          local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar1]) {
LAB_00326d96:
        __assert_fail("i < size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/vector.h"
                      ,0xc1,
                      "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::Field>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::Field>, SizeT = unsigned int]"
                     );
      }
      uVar1 = (ulong)(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar1] << 2);
      local_38 = pOVar6 + *(uint *)(pOVar6 + uVar1 + 4) + uVar1 + 4;
      if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) {
        uVar2 = std::__throw_bad_function_call();
        if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_58.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        _Unwind_Resume(uVar2);
      }
      (*func->_M_invoker)((_Any_data *)func,(Field **)&local_38);
      uVar8 = uVar8 + 1;
      uVar1 = (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_finish -
              (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start >> 2;
      lVar7 = lVar7 + -1;
    } while (uVar8 < uVar1);
  }
  if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ForAllFields(const reflection::Object *object, bool reverse,
                    std::function<void(const reflection::Field *)> func) const {
    const std::vector<uint32_t> field_to_id_map = FieldIdToIndex(object);
    for (size_t i = 0; i < field_to_id_map.size(); ++i) {
      func(object->fields()->Get(
          field_to_id_map[reverse ? field_to_id_map.size() - (i + 1) : i]));
    }
  }